

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

bool_t ecpAddAA(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  word *b_00;
  word *c_00;
  word *pwVar1;
  size_t n;
  int iVar2;
  bool_t bVar3;
  
  n = ec->f->n;
  b_00 = (word *)((long)stack + n * 8);
  c_00 = b_00 + n;
  pwVar1 = c_00 + n;
  iVar2 = wwCmp(a,b,n);
  if (iVar2 == 0) {
    iVar2 = wwCmp(a + n,b + n,ec->f->n);
    if (iVar2 != 0) {
      return 0;
    }
    bVar3 = wwIsZero(b + n,ec->f->n);
    if (bVar3 != 0) {
      return 0;
    }
    (*ec->f->sqr)((word *)stack,a,ec->f,pwVar1);
    zzDoubleMod(b_00,(word *)stack,ec->f->mod,ec->f->n);
    zzAddMod(b_00,b_00,(word *)stack,ec->f->mod,ec->f->n);
    zzAddMod(b_00,b_00,ec->A,ec->f->mod,ec->f->n);
    zzDoubleMod((word *)stack,a + n,ec->f->mod,ec->f->n);
  }
  else {
    zzSubMod((word *)stack,a,b,ec->f->mod,ec->f->n);
    zzSubMod(b_00,a + n,b + n,ec->f->mod,ec->f->n);
  }
  (*ec->f->div)(b_00,b_00,(word *)stack,ec->f,pwVar1);
  (*ec->f->sqr)((word *)stack,b_00,ec->f,pwVar1);
  zzSubMod((word *)stack,(word *)stack,a,ec->f->mod,ec->f->n);
  zzSubMod((word *)stack,(word *)stack,b,ec->f->mod,ec->f->n);
  zzSubMod(c_00,a,(word *)stack,ec->f->mod,ec->f->n);
  (*ec->f->mul)(b_00,b_00,c_00,ec->f,pwVar1);
  zzSubMod(b_00,b_00,a + n,ec->f->mod,ec->f->n);
  wwCopy(c,(word *)stack,ec->f->n);
  wwCopy(c + n,b_00,ec->f->n);
  return 1;
}

Assistant:

bool_t ecpAddAA(word c[], const word a[], const word b[], const ec_o* ec,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n;
	word* t3 = t2 + n;
	stack = t3 + n;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(ecpSeemsOnA(a, ec));
	ASSERT(ecpSeemsOnA(b, ec));
	// xa != xb?
	if (qrCmp(ecX(a), ecX(b), ec->f) != 0)
	{
		// t1 <- xa - xb
		zmSub(t1, ecX(a), ecX(b), ec->f);
		// t2 <- ya - yb
		zmSub(t2, ecY(a, n), ecY(b, n), ec->f);
	}
	else
	{
		// ya != yb или yb == 0 => a == -b => a + b == O
		if (qrCmp(ecY(a, n), ecY(b, n), ec->f) != 0 || 
			qrIsZero(ecY(b, n), ec->f))
			return FALSE;
		// t2 <- 3 xa^2 + A
		qrSqr(t1, ecX(a), ec->f, stack);
		gfpDouble(t2, t1, ec->f);
		zmAdd(t2, t2, t1, ec->f);
		zmAdd(t2, t2, ec->A, ec->f);
		// t1 <- 2 ya
		gfpDouble(t1, ecY(a, n), ec->f);
	}
	// t2 <- t2 / t1 = \lambda
	qrDiv(t2, t2, t1, ec->f, stack);
	// t1 <- \lambda^2 - xa - xb = xc
	qrSqr(t1, t2, ec->f, stack);
	zmSub(t1, t1, ecX(a), ec->f);
	zmSub(t1, t1, ecX(b), ec->f);
	// t3 <- xa - xc
	zmSub(t3, ecX(a), t1, ec->f);
	// t2 <- \lambda(xa - xc) - ya
	qrMul(t2, t2, t3, ec->f, stack);
	zmSub(t2, t2, ecY(a, n), ec->f);
	// выгрузить результат
	qrCopy(ecX(c), t1, ec->f);
	qrCopy(ecY(c, n), t2, ec->f);
	return TRUE;
}